

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O2

void __thiscall
duckdb::StandardBufferManager::BatchRead
          (StandardBufferManager *this,
          vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_true> *handles,
          map<long,_unsigned_long,_std::less<long>,_std::allocator<std::pair<const_long,_unsigned_long>_>_>
          *load_map,block_id_t first_block,block_id_t last_block)

{
  MemoryTag tag;
  BlockManager *this_00;
  data_ptr_t pdVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> args_1;
  reference pvVar2;
  BlockHandle *pBVar3;
  StringUtil *pSVar4;
  idx_t iVar5;
  FileBuffer *pFVar6;
  long lVar7;
  const_iterator cVar8;
  StringUtil *this_01;
  StringUtil *val;
  StringUtil *data;
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> in_stack_fffffffffffffee0;
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> _Var9;
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> _Var10;
  BlockLock lock;
  block_id_t block_id;
  TempBufferPoolReservation reservation;
  BufferHandle buf;
  BufferHandle intermediate_buffer;
  BufferPoolReservation local_80;
  string local_68;
  BufferHandle local_48;
  
  pvVar2 = vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_true>::get<true>(handles,0);
  pBVar3 = shared_ptr<duckdb::BlockHandle,_true>::operator->(pvVar2);
  this_00 = pBVar3->block_manager;
  pSVar4 = (StringUtil *)
           NumericCastImpl<unsigned_long,_long,_false>::Convert((last_block - first_block) + 1);
  if (pSVar4 != (StringUtil *)0x1) {
    iVar5 = BlockManager::GetBlockSize(this_00);
    Allocate(&intermediate_buffer,this,BASE_TABLE,iVar5 * (long)pSVar4,true);
    pFVar6 = BufferHandle::GetFileBuffer(&intermediate_buffer);
    data = pSVar4;
    (*this_00->_vptr_BlockManager[0xd])(this_00,pFVar6,first_block);
    for (val = (StringUtil *)0x0; pSVar4 != val; val = val + 1) {
      lVar7 = NumericCastImpl<long,_unsigned_long,_false>::Convert((unsigned_long)val);
      block_id = lVar7 + first_block;
      cVar8 = ::std::
              _Rb_tree<long,_std::pair<const_long,_unsigned_long>,_std::_Select1st<std::pair<const_long,_unsigned_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_unsigned_long>_>_>
              ::find(&load_map->_M_t,&block_id);
      pvVar2 = vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_true>::get<true>
                         (handles,(size_type)cVar8._M_node[1]._M_parent);
      pBVar3 = shared_ptr<duckdb::BlockHandle,_true>::operator->(pvVar2);
      this_01 = (StringUtil *)(pBVar3->memory_usage).super___atomic_base<unsigned_long>._M_i;
      _Var9._M_head_impl = (FileBuffer *)0x0;
      pBVar3 = shared_ptr<duckdb::BlockHandle,_true>::operator->(pvVar2);
      tag = pBVar3->tag;
      StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_68,this_01,0x400,(idx_t)data);
      args_1._M_string_length = (size_type)in_stack_fffffffffffffee0._M_head_impl;
      args_1._M_dataplus._M_p = (pointer)&local_68;
      args_1.field_2._M_allocated_capacity = (size_type)_Var9._M_head_impl;
      args_1.field_2._8_8_ = first_block;
      EvictBlocksOrThrow<char_const*,std::__cxx11::string>
                (&reservation,this,tag,(idx_t)this_01,
                 (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *)
                 &stack0xfffffffffffffee8,"failed to pin block of size %s%s",args_1);
      ::std::__cxx11::string::~string((string *)&local_68);
      BufferHandle::BufferHandle(&buf);
      pBVar3 = shared_ptr<duckdb::BlockHandle,_true>::operator->(pvVar2);
      ::std::unique_lock<std::mutex>::unique_lock(&lock,&pBVar3->lock);
      pBVar3 = shared_ptr<duckdb::BlockHandle,_true>::operator->(pvVar2);
      if ((pBVar3->state)._M_i == BLOCK_LOADED) {
        BufferPoolReservation::Resize(&reservation.super_BufferPoolReservation,0);
        data = this_01;
        _Var10._M_head_impl = _Var9._M_head_impl;
      }
      else {
        pFVar6 = BufferHandle::GetFileBuffer(&intermediate_buffer);
        pdVar1 = pFVar6->internal_buffer;
        iVar5 = optional_idx::GetIndex(&this_00->block_alloc_size);
        pBVar3 = shared_ptr<duckdb::BlockHandle,_true>::operator->(pvVar2);
        data = (StringUtil *)(pdVar1 + iVar5 * (long)val);
        _Var10._M_head_impl = (FileBuffer *)0x0;
        BufferPoolReservation::BufferPoolReservation
                  (&local_80,&reservation.super_BufferPoolReservation);
        BlockHandle::LoadFromBuffer
                  (&local_48,pBVar3,&lock,(data_ptr_t)data,
                   (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *)
                   &stack0xfffffffffffffee0,&local_80);
        BufferHandle::operator=(&buf,&local_48);
        BufferHandle::~BufferHandle(&local_48);
        BufferPoolReservation::~BufferPoolReservation(&local_80);
        if ((tuple<duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>)
            _Var9._M_head_impl != (_Head_base<0UL,_duckdb::FileBuffer_*,_false>)0x0) {
          (**(code **)(*(long *)_Var9._M_head_impl + 8))();
        }
        in_stack_fffffffffffffee0._M_head_impl = (FileBuffer *)0x0;
      }
      ::std::unique_lock<std::mutex>::~unique_lock(&lock);
      BufferHandle::~BufferHandle(&buf);
      TempBufferPoolReservation::~TempBufferPoolReservation(&reservation);
      if (_Var10._M_head_impl != (FileBuffer *)0x0) {
        (*(_Var10._M_head_impl)->_vptr_FileBuffer[1])();
      }
    }
    BufferHandle::~BufferHandle(&intermediate_buffer);
  }
  return;
}

Assistant:

void StandardBufferManager::BatchRead(vector<shared_ptr<BlockHandle>> &handles, const map<block_id_t, idx_t> &load_map,
                                      block_id_t first_block, block_id_t last_block) {
	auto &block_manager = handles[0]->block_manager;
	idx_t block_count = NumericCast<idx_t>(last_block - first_block + 1);
#ifndef DUCKDB_ALTERNATIVE_VERIFY
	if (block_count == 1) {
		// prefetching with block_count == 1 has no performance impact since we can't batch reads
		// skip the prefetch in this case
		// we do it anyway if alternative_verify is on for extra testing
		return;
	}
#endif

	// allocate a buffer to hold the data of all of the blocks
	auto intermediate_buffer = Allocate(MemoryTag::BASE_TABLE, block_count * block_manager.GetBlockSize());
	// perform a batch read of the blocks into the buffer
	block_manager.ReadBlocks(intermediate_buffer.GetFileBuffer(), first_block, block_count);

	// the blocks are read - now we need to assign them to the individual blocks
	for (idx_t block_idx = 0; block_idx < block_count; block_idx++) {
		block_id_t block_id = first_block + NumericCast<block_id_t>(block_idx);
		auto entry = load_map.find(block_id);
		D_ASSERT(entry != load_map.end()); // if we allow gaps we might not return true here
		auto &handle = handles[entry->second];

		// reserve memory for the block
		idx_t required_memory = handle->GetMemoryUsage();
		unique_ptr<FileBuffer> reusable_buffer;
		auto reservation = EvictBlocksOrThrow(handle->GetMemoryTag(), required_memory, &reusable_buffer,
		                                      "failed to pin block of size %s%s",
		                                      StringUtil::BytesToHumanReadableString(required_memory));
		// now load the block from the buffer
		// note that we discard the buffer handle - we do not keep it around
		// the prefetching relies on the block handle being pinned again during the actual read before it is evicted
		BufferHandle buf;
		{
			auto lock = handle->GetLock();
			if (handle->GetState() == BlockState::BLOCK_LOADED) {
				// the block is loaded already by another thread - free up the reservation and continue
				reservation.Resize(0);
				continue;
			}
			auto block_ptr =
			    intermediate_buffer.GetFileBuffer().InternalBuffer() + block_idx * block_manager.GetBlockAllocSize();
			buf = handle->LoadFromBuffer(lock, block_ptr, std::move(reusable_buffer), std::move(reservation));
		}
	}
}